

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Constant_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *param_1)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  Dispatch_State *param_1_local;
  Constant_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this_local;
  
  Boxed_Value::Boxed_Value((Boxed_Value *)this,(Boxed_Value *)&param_1[3].m_stack_holder);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &) const override { return m_value; }